

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O0

int compute_all_decb(uint8_t dst,uint8_t src1)

{
  byte bVar1;
  target_long tVar2;
  uint8_t src2;
  int of;
  int sf;
  int zf;
  int af;
  int pf;
  int cf;
  uint8_t src1_local;
  uint8_t dst_local;
  
  bVar1 = "\x04"[dst];
  tVar2 = lshift((ulong)dst,0);
  return (uint)(src1 | bVar1) | (byte)(dst ^ dst + 1) & 0x10 | (uint)(dst == '\0') << 6 |
         (uint)tVar2 & 0x80 | (uint)(dst == '\x7f') << 0xb;
}

Assistant:

static int glue(compute_all_dec, SUFFIX)(DATA_TYPE dst, DATA_TYPE src1)
{
    int cf, pf, af, zf, sf, of;
    DATA_TYPE src2;

    cf = (int)src1;
    src1 = dst + 1;
    src2 = 1;
    pf = parity_table[(uint8_t)dst];
    af = (dst ^ src1 ^ src2) & CC_A;
    zf = (dst == 0) * CC_Z;
    sf = lshift(dst, 8 - DATA_BITS) & CC_S;
    of = (dst == SIGN_MASK - 1) * CC_O;
    return cf | pf | af | zf | sf | of;
}